

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

void __thiscall Expr::GenStrFromFormat(Expr *this,Env *env)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long in_RDI;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __stream = _stderr;
  iVar1 = *(int *)(in_RDI + 0x5c);
  if (iVar1 == 1) {
    pcVar6 = expr_fmt[*(uint *)(in_RDI + 0x58)];
    pcVar3 = str((Expr *)0x1331a2);
    strfmt_abi_cxx11_((char *)local_30,pcVar6,pcVar3);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xa8),local_30);
    std::__cxx11::string::~string(local_30);
  }
  else if (iVar1 == 2) {
    pcVar6 = expr_fmt[*(uint *)(in_RDI + 0x58)];
    pcVar3 = str((Expr *)0x133207);
    pcVar4 = str((Expr *)0x13321d);
    strfmt_abi_cxx11_((char *)local_50,pcVar6,pcVar3,pcVar4);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xa8),local_50);
    std::__cxx11::string::~string(local_50);
  }
  else if (iVar1 == 3) {
    pcVar6 = expr_fmt[*(uint *)(in_RDI + 0x58)];
    pcVar3 = str((Expr *)0x13327e);
    pcVar4 = str((Expr *)0x133294);
    pcVar5 = str((Expr *)0x1332aa);
    strfmt_abi_cxx11_((char *)local_70,pcVar6,pcVar3,pcVar4,pcVar5);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xa8),local_70);
    std::__cxx11::string::~string(local_70);
  }
  else if (FLAGS_pac_debug) {
    uVar2 = *(uint *)(in_RDI + 0x5c);
    pcVar6 = orig((Expr *)0x133316);
    fprintf(__stream,"num_operands_ = %d, orig = %s\n",(ulong)uVar2,pcVar6);
  }
  return;
}

Assistant:

void Expr::GenStrFromFormat(Env* env)
	{
	// The format != "@custom@"
	ASSERT(*expr_fmt[expr_type_] != '@');

	switch ( num_operands_ )
		{
		case 1:
			str_ = strfmt(expr_fmt[expr_type_], operand_[0]->str());
			break;
		case 2:
			str_ = strfmt(expr_fmt[expr_type_], operand_[0]->str(), operand_[1]->str());
			break;
		case 3:
			str_ = strfmt(expr_fmt[expr_type_], operand_[0]->str(), operand_[1]->str(),
			              operand_[2]->str());
			break;
		default:
			DEBUG_MSG("num_operands_ = %d, orig = %s\n", num_operands_, orig());
			ASSERT(0);
			break;
		}
	}